

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void msa_sld_df(uint32_t df,wr_t *pwd,wr_t *pws,target_ulong rt)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint8_t v [64];
  int8_t local_48 [72];
  
  if (df < 4) {
    uVar1 = (int)(0x80L >> ((char)df + 3U & 0x3f)) - 1U & (uint)rt;
    switch(df) {
    case 0:
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        local_48[lVar2] = pws->b[lVar2];
        local_48[lVar2 + 0x10] = pwd->b[lVar2];
      }
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        pwd->b[lVar2] = local_48[uVar1 + (int)lVar2];
      }
      break;
    case 1:
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          local_48[lVar3] = pws->b[lVar3];
          local_48[lVar3 + 8] = pwd->b[lVar3];
        }
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          pwd->b[lVar3] = local_48[uVar1 + (int)lVar3];
        }
        pws = (wr_t *)(pws->b + 8);
        pwd = (wr_t *)(pwd->b + 8);
      }
      break;
    case 2:
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
          local_48[lVar3] = pws->b[lVar3];
          local_48[lVar3 + 4] = pwd->b[lVar3];
        }
        for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
          pwd->b[lVar3] = local_48[uVar1 + (int)lVar3];
        }
        pws = (wr_t *)(pws->b + 4);
        pwd = (wr_t *)(pwd->b + 4);
      }
      break;
    case 3:
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
          local_48[lVar3] = pws->b[lVar3];
          local_48[lVar3 + 2] = pwd->b[lVar3];
        }
        for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
          pwd->b[lVar3] = local_48[uVar1 + (int)lVar3];
        }
        pws = (wr_t *)(pws->b + 2);
        pwd = (wr_t *)(pwd->b + 2);
      }
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x1276,"void msa_sld_df(uint32_t, wr_t *, wr_t *, target_ulong)");
}

Assistant:

static inline void msa_sld_df(uint32_t df, wr_t *pwd,
                              wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint8_t v[64];
    uint32_t i, k;

    switch (df) {
    case DF_BYTE:
        CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_BYTE), 0);
        break;
    case DF_HALF:
        for (k = 0; k < 2; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_HALF), k);
        }
        break;
    case DF_WORD:
        for (k = 0; k < 4; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_WORD), k);
        }
        break;
    case DF_DOUBLE:
        for (k = 0; k < 8; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_DOUBLE), k);
        }
        break;
    default:
        assert(0);
    }
}